

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckFunctions.cxx
# Opt level: O3

bool __thiscall kws::Parser::CheckFunctions(Parser *this,char *regEx,unsigned_long maxLength)

{
  string *psVar1;
  bool bVar2;
  size_type sVar3;
  bool bVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  pointer pcVar9;
  pointer pcVar10;
  long *plVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 *puVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong uVar14;
  size_type *psVar15;
  long *plVar16;
  byte bVar17;
  Error error;
  string functionName;
  string functionLine;
  RegularExpression regex;
  undefined1 local_398 [24];
  string local_380 [8];
  size_type local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  string *local_360;
  undefined8 local_358;
  unsigned_long local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  long *local_328;
  long local_320;
  long local_318;
  long lStack_310;
  char *local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  string local_2e0;
  string local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_280;
  RegularExpression local_260;
  
  if (regEx != (char *)0x0) {
    this->m_TestsDone[0x1e] = true;
    std::__cxx11::string::_M_replace
              ((ulong)(this->m_TestsDescription + 0x1e),0,
               (char *)this->m_TestsDescription[0x1e]._M_string_length,0x176f39);
    std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x1e));
  }
  local_308 = regEx;
  if (maxLength != 0) {
    this->m_TestsDone[0x1f] = true;
    psVar1 = this->m_TestsDescription + 0x1f;
    std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)this->m_TestsDescription[0x1f]._M_string_length,0x176f65);
    pcVar5 = (char *)operator_new__(0x16);
    snprintf(pcVar5,0x16,"%ld",maxLength);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    operator_delete__(pcVar5);
  }
  local_260.regmust = (char *)0x0;
  local_260.program = (char *)0x0;
  local_260.progsize = 0;
  memset(&local_260,0,0x20a);
  if (local_308 != (char *)0x0) {
    kwssys::RegularExpression::compile(&local_260,local_308);
  }
  sVar6 = FindFunction(this,0,(char *)0x0);
  if (sVar6 != 0xffffffffffffffff) {
    local_360 = &this->m_BufferNoComment;
    local_358 = 0;
    local_350 = maxLength;
LAB_0015a406:
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"");
    if (0 < (long)sVar6) {
      do {
        if ((local_360->_M_dataplus)._M_p[sVar6] == ')') {
          sVar8 = FindOpeningChar(this,')','(',sVar6,true);
          sVar6 = sVar8 - 1;
          if ((long)sVar8 < 2) goto LAB_0015a4ec;
          bVar4 = false;
          goto LAB_0015a47e;
        }
        bVar4 = 1 < (long)sVar6;
        sVar6 = sVar6 - 1;
      } while (bVar4);
      goto LAB_0015a452;
    }
    goto LAB_0015a4ec;
  }
  bVar17 = 1;
LAB_0015ac17:
  if (local_260.program != (char *)0x0) {
    operator_delete__(local_260.program);
  }
  return (bool)(bVar17 & 1);
LAB_0015a47e:
  do {
    bVar17 = (local_360->_M_dataplus)._M_p[sVar6];
    if (((ulong)bVar17 < 0x2b) && ((0x44100002600U >> ((ulong)bVar17 & 0x3f) & 1) != 0)) {
      if (bVar4) goto LAB_0015a4ec;
      bVar4 = false;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,
                     bVar17,&local_300);
      std::__cxx11::string::operator=((string *)&local_300,(string *)local_398);
      if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
        operator_delete((void *)local_398._0_8_);
      }
      bVar4 = true;
    }
    bVar2 = 1 < (long)sVar6;
    sVar6 = sVar6 - 1;
  } while (bVar2);
LAB_0015a452:
  sVar6 = 0;
LAB_0015a4ec:
  lVar7 = GetLineNumber(this,sVar6,true);
  GetLine_abi_cxx11_(&local_280,this,lVar7 - 1);
  lVar7 = std::__cxx11::string::find((char *)&local_280,0x1762aa,0);
  if ((((((lVar7 == -1) &&
         (lVar7 = std::__cxx11::string::find((char *)&local_280,0x176e4e,0), lVar7 == -1)) &&
        (lVar7 = std::__cxx11::string::find((char *)&local_280,0x176e5a,0), lVar7 == -1)) &&
       (((lVar7 = std::__cxx11::string::find((char *)&local_280,0x176e64,0), lVar7 == -1 &&
         (lVar7 = std::__cxx11::string::find((char *)&local_300,0x169541,0), lVar7 == -1)) &&
        ((lVar7 = std::__cxx11::string::find((char *)&local_300,0x176f81,0), lVar7 == -1 &&
         ((lVar7 = std::__cxx11::string::find((char *)&local_300,0x176f87,0), lVar7 == -1 &&
          (lVar7 = std::__cxx11::string::find((char *)&local_300,0x176528,0), lVar7 == -1)))))))) &&
      (lVar7 = std::__cxx11::string::find((char *)&local_300,0x176523,0), lVar7 == -1)) &&
     (lVar7 = std::__cxx11::string::find((char *)&local_300,0x176e17,0), lVar7 == -1)) {
    uVar14 = std::__cxx11::string::find((char *)&local_300,0x176e42,0);
    lVar7 = std::__cxx11::string::find((char *)&local_300,0x175d52,uVar14);
    if (((uVar14 == 0xffffffffffffffff) || (lVar7 == -1)) || (lVar7 <= (long)uVar14)) {
      if (uVar14 == 0xffffffffffffffff) goto LAB_0015a661;
      std::__cxx11::string::substr((ulong)local_398,(ulong)&local_300);
    }
    else {
      std::__cxx11::string::substr((ulong)local_398,(ulong)&local_300);
    }
    std::__cxx11::string::operator=((string *)&local_300,(string *)local_398);
    if ((undefined1 *)local_398._0_8_ != local_398 + 0x10) {
      operator_delete((void *)local_398._0_8_);
    }
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&local_300,0,(char *)local_300._M_string_length,0x169503);
  }
LAB_0015a661:
  sVar3 = local_300._M_string_length;
  sVar6 = std::__cxx11::string::find((char)local_360,0x7b);
  if ((char *)sVar3 == (char *)0x0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"");
    sVar6 = FindClosingChar(this,'{','}',sVar6,true,&local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    sVar6 = FindFunction(this,sVar6 + 1,(char *)0x0);
  }
  else {
    sVar8 = GetPositionWithComments(this,sVar6);
    pcVar9 = (pointer)GetLineNumber(this,sVar8,false);
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"");
    sVar8 = FindClosingChar(this,'{','}',sVar6,true,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    sVar6 = GetPositionWithComments(this,sVar8);
    pcVar10 = (pointer)GetLineNumber(this,sVar6,false);
    sVar6 = FindFunction(this,sVar8 + 1,(char *)0x0);
    if ((long)sVar6 < (long)sVar8) {
      sVar6 = std::__cxx11::string::find((char)local_360,0x7b);
      sVar6 = FindFunction(this,sVar6,(char *)0x0);
    }
    bVar4 = kwssys::RegularExpression::find
                      (&local_260,local_300._M_dataplus._M_p,&local_260.regmatch);
    if (!bVar4) {
      local_380 = (string  [8])&local_370;
      local_378 = 0;
      local_370._M_local_buf[0] = '\0';
      local_398._16_8_ = 0x1e;
      local_398._0_8_ = pcVar9;
      local_398._8_8_ = pcVar9;
      std::operator+(&local_2a0,"function (",&local_300);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2a0);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      psVar15 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_348.field_2._M_allocated_capacity = *psVar15;
        local_348.field_2._8_8_ = plVar11[3];
      }
      else {
        local_348.field_2._M_allocated_capacity = *psVar15;
        local_348._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_348._M_string_length = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_348);
      plVar16 = plVar11 + 2;
      if ((long *)*plVar11 == plVar16) {
        local_318 = *plVar16;
        lStack_310 = plVar11[3];
        local_328 = &local_318;
      }
      else {
        local_318 = *plVar16;
        local_328 = (long *)*plVar11;
      }
      local_320 = plVar11[1];
      *plVar11 = (long)plVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=(local_380,(string *)&local_328);
      if (local_328 != &local_318) {
        operator_delete(local_328);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
        operator_delete(local_2a0._M_dataplus._M_p);
      }
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                (&this->m_ErrorList,(value_type *)local_398);
      paVar13 = &local_370;
      if (local_380 != (string  [8])paVar13) {
        operator_delete((void *)local_380);
        paVar13 = extraout_RAX;
      }
      local_358 = CONCAT71((int7)((ulong)paVar13 >> 8),1);
    }
    if (((local_350 != 0) && (-1 < (long)((ulong)pcVar10 | (ulong)pcVar9))) &&
       ((long)local_350 < (long)pcVar10 - (long)pcVar9)) {
      local_380 = (string  [8])&local_370;
      local_378 = 0;
      local_370._M_local_buf[0] = '\0';
      local_398._16_8_ = 0x1f;
      local_398._0_8_ = pcVar9;
      local_398._8_8_ = pcVar10;
      std::operator+(&local_348,"function (",&local_300);
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_348);
      plVar11 = puVar12 + 2;
      if ((long *)*puVar12 == plVar11) {
        local_318 = *plVar11;
        lStack_310 = puVar12[3];
        local_328 = &local_318;
      }
      else {
        local_318 = *plVar11;
        local_328 = (long *)*puVar12;
      }
      local_320 = puVar12[1];
      *puVar12 = plVar11;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      std::__cxx11::string::operator=(local_380,(string *)&local_328);
      if (local_328 != &local_318) {
        operator_delete(local_328);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
      pcVar5 = (char *)operator_new__(0x16);
      snprintf(pcVar5,0x16,"%ld",(long)pcVar10 - (long)pcVar9);
      std::__cxx11::string::append((char *)local_380);
      std::__cxx11::string::append((char *)local_380);
      snprintf(pcVar5,0x16,"%ld",local_350);
      std::__cxx11::string::append((char *)local_380);
      std::__cxx11::string::append((char *)local_380);
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                (&this->m_ErrorList,(value_type *)local_398);
      operator_delete__(pcVar5);
      paVar13 = &local_370;
      if (local_380 != (string  [8])paVar13) {
        operator_delete((void *)local_380);
        paVar13 = extraout_RAX_00;
      }
      local_358 = CONCAT71((int7)((ulong)paVar13 >> 8),1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if (sVar6 == 0xffffffffffffffff) goto LAB_0015ac0b;
  goto LAB_0015a406;
LAB_0015ac0b:
  bVar17 = (byte)local_358 ^ 1;
  goto LAB_0015ac17;
}

Assistant:

bool Parser::CheckFunctions(const char* regEx,unsigned long maxLength)
{
  if(regEx)
    {
    m_TestsDone[FUNCTION_REGEX] = true;
    m_TestsDescription[FUNCTION_REGEX] = "Functions should match regular expression: ";
    m_TestsDescription[FUNCTION_REGEX] += regEx;
    }

  if(maxLength>0)
    {
    m_TestsDone[FUNCTION_LENGTH] = true;
    m_TestsDescription[FUNCTION_LENGTH] = "Functions must not exceed: ";
    constexpr size_t length = 22;
    char* temp = new char[length];
    snprintf(temp,length,"%ld",maxLength);
    m_TestsDescription[FUNCTION_LENGTH] += temp;
    m_TestsDescription[FUNCTION_LENGTH] += " lines";
    delete [] temp;
    }

  // First we need to find the parameters
  bool hasError = false;

  kwssys::RegularExpression regex(regEx);

  // List all the function in the file
  auto pos = static_cast<long int>(this->FindFunction(0));
  while(pos != -1)
    {
    // We extract the name of the function
    std::string functionName = "";
    // Find the ) and the openning (
    long int i=pos;
    for(;i>0;i--)
      {
      if(m_BufferNoComment[i] == ')')
        {
        i = static_cast<long int>(this->FindOpeningChar(')','(',i,true));
        i--;
        break;
        }
      }

    bool inWord = false;
    for(;i>0;i--)
      {
      if(m_BufferNoComment[i] != ' ' && m_BufferNoComment[i] != '\t'
         && m_BufferNoComment[i] != '\r' && m_BufferNoComment[i] != '\n'
         && m_BufferNoComment[i] != '*' && m_BufferNoComment[i] != '&')
        {
        inWord = true;
        functionName = m_BufferNoComment[i]+functionName;
        }
      else if(inWord)
        {
        break;
        }
      }

    // Check that this is not a #define (tricky)
    std::string functionLine = this->GetLine(this->GetLineNumber(i,true)-1);

    if(functionLine.find("#define") == std::string::npos
       && functionLine.find("_attribute_") == std::string::npos
       && functionLine.find(" operator") == std::string::npos
       && functionLine.find("friend ") == std::string::npos
       && functionName.find("if") == std::string::npos
       && functionName.find("while") == std::string::npos
       && functionName.find("for") == std::string::npos
       && functionName.find("switch") == std::string::npos
       && functionName.find("main") == std::string::npos
       && functionName.find("~") == std::string::npos // skip destructor for now...
       )
      {
      auto posf = static_cast<long int>(functionName.find("::", 0));
      auto posp = static_cast<long int>(functionName.find("(", posf));
      if(posp != -1 && posf != -1 && posp>posf)
        {
        functionName = functionName.substr(posf+2,posp-posf-2);
        }
      else if(posf != -1)
        {
        functionName = functionName.substr(posf+2,functionName.size()-posf-2);
        }
      }
    else
      {
      functionName = "";
      }

    //std::cout << "Function Name = " << functionName.c_str() << std::endl;

      if (functionName.empty()) {
        auto bf = static_cast<long int>(m_BufferNoComment.find('{', pos));
        long int pos2 =
            static_cast<long int>(this->FindClosingChar('{', '}', bf, true));
        pos = static_cast<long int>(this->FindFunction(pos2 + 1));

        // we cannot go backward
        /*if(pos2 > pos)
          {
          long int bf = m_BufferNoComment.find('{',pos2);
          pos = this->FindFunction(bf);
          }*/
        continue;
      } else if (!functionName.empty()) {
        auto bf = static_cast<long int>(m_BufferNoComment.find('{', pos));
        auto bfcomments = static_cast<long int>(GetPositionWithComments(bf));
        auto bfl = static_cast<long int>(this->GetLineNumber(bfcomments));
        long int pos2 =
            static_cast<long int>(this->FindClosingChar('{', '}', bf, true));
        auto poscomments = static_cast<long int>(GetPositionWithComments(pos2));
        long int efl = this->GetLineNumber(poscomments);

        pos = static_cast<long int>(this->FindFunction(pos2 + 1));

        // we cannot go backward
        if (pos2 > pos) {
          auto localbf =
              static_cast<long int>(m_BufferNoComment.find('{', pos2));
          pos = static_cast<long int>(this->FindFunction(localbf));
        }

      if(!regex.find(functionName))
        {
        Error error;
        error.line = bfl;
        error.line2 = error.line;
        error.number = FUNCTION_REGEX;
        error.description = "function (" + functionName + ") doesn't match regular expression: " + regEx;
        m_ErrorList.push_back(error);
        hasError = true;
        }

      if(maxLength>0)
        {
        if((bfl>-1) && (efl>-1) && (efl-bfl>(long int)maxLength))
          {
          Error error;
          error.line = bfl;
          error.line2 = efl;
          error.number = FUNCTION_LENGTH;
          error.description = "function (" + functionName + ") has too many lines: ";
          constexpr size_t length = 22;
          char* temp = new char[length];
          snprintf(temp,length,"%ld",efl-bfl);
          error.description += temp;
          error.description += " (";
          snprintf(temp,length,"%ld",maxLength);
          error.description += temp;
          error.description += ")";
          m_ErrorList.push_back(error);
          hasError = true;
          delete [] temp;
          }
        }
      }
    }

  return !hasError;
}